

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
__thiscall V4L2Device::decompress_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  bool bVar1;
  Options *this_00;
  undefined8 uVar2;
  JDIMENSION JVar3;
  undefined1 uVar4;
  int iVar5;
  OptionDetails *this_01;
  bool *pbVar6;
  Writer *pWVar7;
  pointer __p;
  pointer __p_00;
  uint *in_RDX;
  undefined8 extraout_RDX;
  tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  tVar8;
  RawImagePtr image;
  allocator local_4b1;
  uchar *buffer_array [1];
  jpeg_decompress_struct cinfo;
  JPEGErrorManager jerr;
  
  image._M_t.super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
  ._M_t.super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
  super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
       (__uniq_ptr_data<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>,_true,_true>
       )(__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>)0x0;
  jerr.options.super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  jerr.options.super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&jerr.options.super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2> *)&bufferinfo[5].field_12);
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  jerr.pub.error_exit = jpeg_error_exit_cb;
  jerr.pub.output_message = jpeg_output_message_cb;
  iVar5 = _setjmp((__jmp_buf_tag *)jerr.setjmp_buffer);
  if (iVar5 == 0) {
    jpeg_CreateDecompress(&cinfo,0x50,0x290);
    uVar2._0_4_ = (&bufferinfo->timecode)[(ulong)*in_RDX - 2].type;
    uVar2._4_4_ = (&bufferinfo->timecode)[(ulong)*in_RDX - 2].flags;
    jpeg_mem_src(&cinfo,uVar2,in_RDX[0x12]);
    iVar5 = jpeg_read_header(&cinfo,1);
    if (iVar5 == 1) {
      jpeg_start_decompress(&cinfo);
      JVar3 = cinfo.output_height;
      __p = (pointer)operator_new(0x10);
      (__p->raw_data)._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
      __p->width = 0;
      __p->height = 0;
      buffer_array[0] = (uchar *)0x0;
      std::__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::reset
                ((__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                  *)&image,__p);
      std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::~unique_ptr
                ((unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_> *)
                 buffer_array);
      __p_00 = (pointer)operator_new__((ulong)(cinfo.output_components * cinfo.output_width * JVar3)
                                      );
      buffer_array[0] = (uchar *)0x0;
      std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
                ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
                 image._M_t.
                 super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
                 .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl,__p_00);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)buffer_array)
      ;
      *(JDIMENSION *)
       ((long)image._M_t.
              super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
              ._M_t.
              super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
              .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl + 8) =
           cinfo.output_width;
      *(JDIMENSION *)
       ((long)image._M_t.
              super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
              ._M_t.
              super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
              .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl + 0xc) = JVar3;
      while (cinfo.output_scanline < cinfo.output_height) {
        buffer_array[0] =
             (uchar *)((ulong)(cinfo.output_scanline * cinfo.output_components * cinfo.output_width)
                      + *(long *)image._M_t.
                                 super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
                                 .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl)
        ;
        jpeg_read_scanlines(&cinfo,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                    *)buffer_array,1);
      }
      jpeg_finish_decompress(&cinfo);
      jpeg_destroy_decompress(&cinfo);
      *(__uniq_ptr_data<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>,_true,_true>
        *)this = image._M_t.
                 super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
                 .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl;
      uVar4 = 1;
      goto LAB_0015334b;
    }
    buffer_array[0] = "\x12\x1c\x14";
    pWVar7 = el::base::Writer::construct((Writer *)buffer_array,1,"default");
    el::base::Writer::operator<<(pWVar7,(char (*) [12])"broken JPEG");
    el::base::Writer::~Writer((Writer *)buffer_array);
  }
  else {
    this_00 = *(Options **)&bufferinfo[5].field_12;
    std::__cxx11::string::string((string *)buffer_array,"quiet",&local_4b1);
    this_01 = cxxopts::Options::operator[](this_00,(string *)buffer_array);
    pbVar6 = cxxopts::OptionDetails::as<bool>(this_01);
    bVar1 = *pbVar6;
    std::__cxx11::string::~string((string *)buffer_array);
    if (bVar1 == false) {
      buffer_array[0] = "\x12\x1c\x14";
      pWVar7 = el::base::Writer::construct((Writer *)buffer_array,1,"default");
      el::base::Writer::operator<<(pWVar7,&jpeg_last_error_msg);
      el::base::Writer::~Writer((Writer *)buffer_array);
    }
    jpeg_destroy_decompress(&cinfo);
  }
  *(__uniq_ptr_data<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>,_true,_true> *)
   this = image._M_t.
          super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>.
          _M_t.
          super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>
          .super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl;
  uVar4 = 0;
LAB_0015334b:
  image._M_t.super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>
  ._M_t.super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
  super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
       (__uniq_ptr_data<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>,_true,_true>
       )(__uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>)0x0;
  *(undefined1 *)&(this->buffers)._M_elems[0].start = uVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&jerr.options.super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>::~unique_ptr
            (&image);
  tVar8.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ._8_8_ = extraout_RDX;
  tVar8.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>._M_t.
  super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
  super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
       (_Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
        )(_Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
          )this;
  return (tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
          )tVar8.
           super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ;
}

Assistant:

std::tuple<bool, RawImagePtr>
    decompress_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        struct jpeg_decompress_struct cinfo;
        RawImagePtr image;

        JPEGErrorManager jerr;
        jerr.options = options;
        cinfo.err = jpeg_std_error(&jerr.pub);
        jerr.pub.error_exit = jpeg_error_exit_cb;
        jerr.pub.output_message = jpeg_output_message_cb;

        if (setjmp(jerr.setjmp_buffer)) {
            // If we get here, the JPEG code has signaled an error.
            auto quiet = (*options)["quiet"].as<bool>();
            if (not quiet) {
                LOG(WARNING) << jpeg_last_error_msg;
            }

            jpeg_destroy_decompress(&cinfo);

            return std::make_tuple(false, std::move(image));
        }

        jpeg_create_decompress(&cinfo);

        auto idx = bufferinfo.index;
        jpeg_mem_src(&cinfo, static_cast<unsigned char*>(buffers[idx].start), bufferinfo.length);

        auto rc = jpeg_read_header(&cinfo, TRUE);
        if (rc != 1) {
            LOG(ERROR) << "broken JPEG";
            return std::make_tuple(false, std::move(image));
        }

        jpeg_start_decompress(&cinfo);

        auto width = cinfo.output_width;
        auto height = cinfo.output_height;
        auto pixel_size = cinfo.output_components;
        auto row_stride = width * pixel_size;
        auto raw_size = width * height * pixel_size;

        image = RawImagePtr(new RawImage);

        image->raw_data = MemBufferPtr(new unsigned char[raw_size]);
        image->width = width;
        image->height = height;

        while (cinfo.output_scanline < cinfo.output_height) {
            unsigned char* buffer_array[1];
            buffer_array[0] = image->raw_data.get() + (cinfo.output_scanline) * row_stride;
            jpeg_read_scanlines(&cinfo, buffer_array, 1);
        }

        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);

        return std::make_tuple(true, std::move(image));
    }